

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelIdentifier.cpp
# Opt level: O2

Data * __thiscall csm::MIC::Data::operator=(Data *this,Data *argData)

{
  Type TVar1;
  int iVar2;
  double dVar3;
  string local_38;
  
  TVar1 = argData->theType;
  if (TVar1 == DOUBLE_TYPE) {
    dVar3 = dblValue(argData);
    clear(this);
    this->theType = DOUBLE_TYPE;
    (this->field_1).theDbl = dVar3;
  }
  else if (TVar1 == INT_TYPE) {
    iVar2 = intValue(argData);
    clear(this);
    this->theType = INT_TYPE;
    (this->field_1).theInt = iVar2;
  }
  else if (TVar1 == STRING_TYPE) {
    strValue_abi_cxx11_(&local_38,argData);
    setValue(this,&local_38,true);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return this;
}

Assistant:

Data& Data::operator=(const Data& argData)
{
   switch(argData.type())
   {
   case STRING_TYPE  : setValue(argData.strValue()); break;
   case INT_TYPE     : setValue(argData.intValue()); break;
   case DOUBLE_TYPE  : setValue(argData.dblValue()); break;
   }
   
   return *this;
}